

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O0

bool compareHelper<double,double>
               (bool success,char *failureMsg,double *val1,double *val2,char *actual,char *expected,
               char *file,int line,bool hasValues)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  char *in_RCX;
  double *in_RDX;
  char *in_RSI;
  byte in_DIL;
  byte bVar4;
  long in_R8;
  long in_R9;
  long in_FS_OFFSET;
  byte in_stack_00000018;
  char msg [4096];
  undefined8 in_stack_ffffffffffffefa8;
  undefined4 in_stack_ffffffffffffefb0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffefb4;
  char *in_stack_ffffffffffffefb8;
  undefined1 in_stack_ffffffffffffefc6;
  undefined4 in_stack_ffffffffffffeff0;
  undefined2 in_stack_ffffffffffffeff4;
  undefined1 in_stack_ffffffffffffeff7;
  char cVar6;
  undefined7 in_stack_ffffffffffffeff9;
  char *in_stack_fffffffffffff000;
  char *in_stack_fffffffffffff010;
  ComparisonOperation in_stack_fffffffffffff018;
  char *in_stack_fffffffffffff048;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = in_DIL & 1;
  cVar6 = '\0';
  if (in_R9 == 0) {
    qt_assert("expected",
              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestresult.cpp"
              ,0x1b5);
  }
  if (in_R8 == 0) {
    qt_assert("actual",
              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestresult.cpp"
              ,0x1b6);
  }
  iVar3 = QTestLog::verboseLevel();
  if (1 < iVar3) {
    snprintf(&stack0xffffffffffffeff8,0x1000,"QCOMPARE(%s, %s)",in_R8,in_R9);
    QTestLog::info(in_stack_fffffffffffff048,(char *)CONCAT71(in_stack_ffffffffffffeff9,cVar6),
                   CONCAT13(in_stack_ffffffffffffeff7,CONCAT12(bVar4,in_stack_ffffffffffffeff4)));
  }
  if ((double *)in_RSI == (double *)0x0) {
    in_RSI = "Compared values are not the same";
  }
  iVar3 = (int)((ulong)in_stack_ffffffffffffefa8 >> 0x20);
  if ((bVar4 & 1) == 0) {
    if ((in_stack_00000018 & 1) == 0) {
      snprintf(&stack0xffffffffffffeff8,0x1000,"%s",in_RSI);
      bVar2 = checkStatement((bool)in_stack_ffffffffffffefc6,in_stack_ffffffffffffefb8,
                             (char *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                             iVar3);
    }
    else {
      uVar5 = 0;
      formatFailMessage<double,double>
                (in_stack_fffffffffffff000,CONCAT71(in_stack_ffffffffffffeff9,cVar6),
                 (char *)CONCAT17(in_stack_ffffffffffffeff7,
                                  CONCAT16(bVar4,CONCAT24(in_stack_ffffffffffffeff4,
                                                          in_stack_ffffffffffffeff0))),
                 (double *)in_RSI,in_RDX,in_RCX,in_stack_fffffffffffff010,in_stack_fffffffffffff018)
      ;
      bVar2 = checkStatement((bool)in_stack_ffffffffffffefc6,in_stack_ffffffffffffefb8,
                             (char *)CONCAT44(in_stack_ffffffffffffefb4,uVar5),
                             (int)((ulong)in_R9 >> 0x20));
    }
  }
  else {
    if (QTest::expectFailMode != 0) {
      snprintf(&stack0xffffffffffffeff8,0x1000,"QCOMPARE(%s, %s) returned TRUE unexpectedly.",in_R8,
               in_R9);
    }
    bVar2 = checkStatement((bool)in_stack_ffffffffffffefc6,in_stack_ffffffffffffefb8,
                           (char *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                           iVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

static bool compareHelper(bool success, const char *failureMsg,
                          const Actual &val1, const Expected &val2,
                          const char *actual, const char *expected,
                          const char *file, int line,
                          bool hasValues = true)
{
    Q_DECL_UNINITIALIZED char msg[maxMsgLen];
    msg[0] = '\0';

    QTEST_ASSERT(expected);
    QTEST_ASSERT(actual);

    if (QTestLog::verboseLevel() >= 2) {
        std::snprintf(msg, maxMsgLen, "QCOMPARE(%s, %s)", actual, expected);
        QTestLog::info(msg, file, line);
    }

    if (!failureMsg)
        failureMsg = "Compared values are not the same";

    if (success) {
        if (QTest::expectFailMode) {
            std::snprintf(msg, maxMsgLen,
                          "QCOMPARE(%s, %s) returned TRUE unexpectedly.", actual, expected);
        }
        return checkStatement(success, msg, file, line);
    }


    if (!hasValues) {
        std::snprintf(msg, maxMsgLen, "%s", failureMsg);
        return checkStatement(success, msg, file, line);
    }

    formatFailMessage(msg, maxMsgLen, failureMsg, val1, val2, actual, expected,
                      QTest::ComparisonOperation::CustomCompare);

    return checkStatement(success, msg, file, line);
}